

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre.cc
# Opt level: O0

void __thiscall re2::PCRE::PCRE(PCRE *this,string *pattern,PCRE_Options *re_option)

{
  bool report_errors;
  Option options;
  int match_limit;
  int stack_limit;
  char *pattern_00;
  PCRE_Options *re_option_local;
  string *pattern_local;
  PCRE *this_local;
  
  std::__cxx11::string::string((string *)this);
  pattern_00 = (char *)std::__cxx11::string::c_str();
  options = PCRE_Options::option(re_option);
  match_limit = PCRE_Options::match_limit(re_option);
  stack_limit = PCRE_Options::stack_limit(re_option);
  report_errors = PCRE_Options::report_errors(re_option);
  Init(this,pattern_00,options,match_limit,stack_limit,report_errors);
  return;
}

Assistant:

PCRE::PCRE(const string& pattern, const PCRE_Options& re_option) {
  Init(pattern.c_str(), re_option.option(), re_option.match_limit(),
       re_option.stack_limit(), re_option.report_errors());
}